

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_543c74::EnableIfAttr::printLeft(EnableIfAttr *this,OutputStream *S)

{
  size_t sVar1;
  
  OutputStream::grow(S,0xc);
  builtin_strncpy(S->Buffer + S->CurrentPosition," [enable_if:",0xc);
  S->CurrentPosition = S->CurrentPosition + 0xc;
  NodeArray::printWithComma(&this->Conditions,S);
  OutputStream::grow(S,1);
  sVar1 = S->CurrentPosition;
  S->CurrentPosition = sVar1 + 1;
  S->Buffer[sVar1] = ']';
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += " [enable_if:";
    Conditions.printWithComma(S);
    S += ']';
  }